

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O2

int __thiscall
pstore::brokerface::channel<std::condition_variable>::remove
          (channel<std::condition_variable> *this,char *__filename)

{
  int iVar1;
  iterator iVar2;
  key_type local_18;
  
  local_18 = (key_type)__filename;
  std::mutex::lock(&this->mut_);
  iVar2 = std::
          _Hashtable<pstore::brokerface::subscriber<std::condition_variable>_*,_pstore::brokerface::subscriber<std::condition_variable>_*,_std::allocator<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::__detail::_Identity,_std::equal_to<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::hash<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->subscribers_)._M_h,&local_18);
  if (iVar2.
      super__Node_iterator_base<pstore::brokerface::subscriber<std::condition_variable>_*,_false>.
      _M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<pstore::brokerface::subscriber<std::condition_variable>_*,_pstore::brokerface::subscriber<std::condition_variable>_*,_std::allocator<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::__detail::_Identity,_std::equal_to<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::hash<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(this->subscribers_)._M_h,&local_18);
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)this);
    return iVar1;
  }
  assert_failed("subscribers_.find (sub) != subscribers_.end ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/brokerface/pubsub.hpp"
                ,0x130);
}

Assistant:

void channel<ConditionVariable>::remove (subscriber_type * sub) noexcept {
            std::lock_guard<std::mutex> const lock{mut_};
            PSTORE_ASSERT (subscribers_.find (sub) != subscribers_.end ());
            subscribers_.erase (sub);
        }